

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O2

void gguf_set_val_u32(gguf_context *ctx,char *key,uint32_t val)

{
  bool bVar1;
  uint uVar2;
  allocator<char> local_4d;
  uint32_t local_4c;
  char *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_4c = val;
  local_48 = key;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,key,&local_4d);
  bVar1 = std::operator==(&local_40,"general.alignment");
  if ((bVar1) &&
     (uVar2 = val - (val >> 1 & 0x55555555),
     uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333),
     ((uVar2 >> 4) + uVar2 & 0xf0f0f0f) * 0x1010101 >> 0x18 != 1)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/gguf.cpp",
               0x3a5,"GGML_ASSERT(%s) failed",
               "val > 0 && (val & (val - 1)) == 0 && GGUF_KEY_GENERAL_ALIGNMENT \" must be power of 2\""
              );
  }
  std::__cxx11::string::~string((string *)&local_40);
  gguf_remove_key(ctx,key);
  std::vector<gguf_kv,std::allocator<gguf_kv>>::emplace_back<char_const*&,unsigned_int&>
            ((vector<gguf_kv,std::allocator<gguf_kv>> *)&ctx->kv,&local_48,&local_4c);
  return;
}

Assistant:

void gguf_set_val_u32(struct gguf_context * ctx, const char * key, uint32_t val) {
    gguf_check_reserved_keys(key, val);
    gguf_remove_key(ctx, key);
    ctx->kv.emplace_back(key, val);
}